

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O0

void __thiscall interface::interface(interface *this,string *config_text)

{
  size_type sVar1;
  size_type sVar2;
  invalid_argument *piVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  size_type sVar7;
  string local_108;
  string local_e8 [32];
  string local_c8 [39];
  undefined1 local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  ulong local_60;
  size_type alias_pos;
  size_type local_28;
  size_type end;
  size_type pos;
  string *config_text_local;
  interface *this_local;
  
  pos = (size_type)config_text;
  config_text_local = (string *)this;
  boost::asio::serial_port_base::baud_rate::baud_rate(&this->baud_rate_,0x2648);
  boost::asio::serial_port_base::parity::parity(&this->parity_,none);
  boost::asio::serial_port_base::stop_bits::stop_bits(&this->stop_bits_,one);
  boost::asio::serial_port_base::character_size::character_size(&this->character_size_,8);
  std::__cxx11::string::string((string *)&this->device_);
  std::__cxx11::string::string((string *)&this->alias_);
  end = std::__cxx11::string::find_first_not_of((char *)pos,0x1e773c);
  if (end == 0xffffffffffffffff) {
    end = std::__cxx11::string::size();
  }
  local_28 = std::__cxx11::string::find((char)pos,0x3a);
  if (local_28 == 0xffffffffffffffff) {
    local_28 = std::__cxx11::string::size();
  }
  sVar1 = end;
  sVar2 = std::__cxx11::string::size();
  if ((sVar1 != sVar2) && (end != local_28)) {
    std::__cxx11::string::string((string *)&alias_pos,(string *)pos,end,local_28 - end);
    std::__cxx11::string::operator=((string *)&this->device_,(string *)&alias_pos);
    std::__cxx11::string::~string((string *)&alias_pos);
    std::__cxx11::string::operator=((string *)&this->alias_,(string *)&this->device_);
    pcVar4 = (char *)std::__cxx11::string::back();
    if (*pcVar4 == ')') {
      local_60 = std::__cxx11::string::find((char)this + '\x10',0x28);
      if (local_60 == 0xffffffffffffffff) {
        local_a1 = 1;
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_a0,"alias begin not found: \"",&this->device_);
        std::operator+(&local_80,&local_a0,"\"");
        std::invalid_argument::invalid_argument(piVar3,(string *)&local_80);
        local_a1 = 0;
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      uVar5 = local_60 + 1;
      lVar6 = std::__cxx11::string::size();
      std::__cxx11::string::string(local_c8,(string *)&this->device_,uVar5,(lVar6 - local_60) - 2);
      std::__cxx11::string::operator=((string *)&this->alias_,local_c8);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::string(local_e8,(string *)&this->device_,0,local_60);
      std::__cxx11::string::operator=((string *)&this->device_,local_e8);
      std::__cxx11::string::~string(local_e8);
    }
    sVar1 = local_28;
    sVar7 = std::__cxx11::string::size();
    sVar2 = pos;
    if (sVar1 != sVar7) {
      uVar5 = local_28 + 1;
      lVar6 = std::__cxx11::string::size();
      std::__cxx11::string::string((string *)&local_108,(string *)sVar2,uVar5,lVar6 - local_28);
      parse_communication_parameters(this,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
    return;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"device name required.");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

interface::interface( const std::string& config_text )
    : baud_rate_( 9800 )
{
    auto pos = config_text.find_first_not_of( " \t\n" );

    if ( pos == std::string::npos )
        pos = config_text.size();

    auto end = config_text.find( ':', pos );

    if ( end == std::string::npos )
        end = config_text.size();

    if ( pos == config_text.size() || pos == end )
        throw std::invalid_argument( "device name required." );

    device_ = std::string( config_text, pos, end - pos );
    alias_  = device_;

    if ( device_.back() == ')' )
    {
        auto alias_pos = device_.find( '(' );
        if ( alias_pos == std::string::npos )
            throw std::invalid_argument( "alias begin not found: \"" + device_ + "\"" );

        alias_  = std::string( device_, alias_pos + 1, device_.size() - 2 - alias_pos );
        device_ = std::string( device_, 0, alias_pos );
    }

    if ( end != config_text.size() )
        parse_communication_parameters( std::string( config_text, end +1, config_text.size() - end ) );
}